

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O3

Matrix4d *
opengv::relative_pose::modules::ge::composeG
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ActualDstType actualDst;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_9,_1,_0,_9,_1> Rowst;
  rotation_t R;
  Scalar local_258;
  Matrix4d *local_250;
  Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> local_248;
  Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> local_240;
  double local_238;
  undefined8 uStack_230;
  double local_228;
  double local_220;
  undefined1 local_218 [16];
  Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
  local_200;
  double *local_1d8;
  double local_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  double dStack_1b0;
  undefined1 local_1a8 [16];
  double local_198;
  double dStack_190;
  double dStack_188;
  undefined1 local_178 [16];
  double local_168;
  undefined1 auStack_160 [16];
  double dStack_150;
  undefined1 local_148 [16];
  double local_138;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  non_const_type local_88;
  undefined1 local_80 [64];
  undefined8 local_40;
  non_const_type local_38;
  
  local_250 = __return_storage_ptr__;
  math::cayley2rot_reduced(cayley);
  auVar125._8_8_ = local_b0;
  auVar125._0_8_ = local_b0;
  dVar2 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar2;
  auVar121._8_8_ = local_98;
  auVar121._0_8_ = local_98;
  auVar120._8_8_ = local_c8;
  auVar120._0_8_ = local_c8;
  local_218._8_8_ = 0;
  local_218._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  dVar3 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar4 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar4;
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar57 = *(undefined1 (*) [16])
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array;
  auVar130._8_8_ = dStack_b8;
  auVar130._0_8_ = dStack_b8;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uStack_a0;
  auVar49 = vmovddup_avx512vl(auVar58);
  auVar58 = *(undefined1 (*) [16])
             ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 3);
  auVar60 = *(undefined1 (*) [16])
             ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 6);
  auVar72 = *(undefined1 (*) [16])
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array;
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar50 = vmulsd_avx512f(auVar146,auVar121);
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar51 = vmulsd_avx512f(auVar140,auVar121);
  auVar52 = vmulpd_avx512vl(auVar57,auVar120);
  auVar163._8_8_ = 0;
  auVar163._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar53 = vunpcklpd_avx512vl(auVar163,auVar146);
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar54 = vunpcklpd_avx512vl(auVar149,auVar140);
  auVar52 = vfmadd231pd_avx512vl(auVar52,auVar58,auVar125);
  auVar55 = vfmadd231pd_avx512vl(auVar52,auVar60,auVar121);
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       local_b0 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar56 = vaddsd_avx512f(auVar51,auVar131);
  auVar132._8_8_ = dStack_d0;
  auVar132._0_8_ = dStack_d0;
  auVar57 = vmulpd_avx512vl(auVar132,auVar57);
  auVar57 = vfmadd231pd_avx512vl(auVar57,auVar130,auVar58);
  auVar58 = vmulsd_avx512f(auVar49,auVar149);
  auVar51 = vmulpd_avx512vl(auVar132,auVar72);
  auVar59 = vfmadd231pd_avx512vl(auVar57,auVar49,auVar60);
  auVar60 = vmulsd_avx512f(auVar130,auVar163);
  auVar57 = *(undefined1 (*) [16])
             ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 3);
  auVar58 = vaddsd_avx512f(auVar60,auVar58);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar52 = vmulsd_avx512f(auVar132,auVar167);
  auVar61 = vunpcklpd_avx512vl(auVar167,auVar123);
  auVar48._8_8_ = uStack_a0;
  auVar48._0_8_ = local_a8;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_b0 * -2.0;
  auVar60 = vmulsd_avx512f(auVar102,auVar60);
  dVar45 = local_c8 * -2.0;
  auVar62 = vmulsd_avx512f(auVar121,ZEXT816(0xc000000000000000));
  auVar63 = vaddsd_avx512f(auVar52,auVar58);
  auVar47._8_8_ = dStack_b8;
  auVar47._0_8_ = local_c0;
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar58 = vmulsd_avx512f(auVar143,auVar62);
  auVar64 = vfmadd231pd_avx512vl(auVar51,auVar130,auVar57);
  auVar58 = vaddsd_avx512f(auVar58,auVar60);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar60 = vmulsd_avx512f(auVar152,auVar62);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       dVar45 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0];
  auVar65 = vaddsd_avx512f(auVar93,auVar58);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar58 = vmulsd_avx512f(auVar102,auVar51);
  auVar58 = vaddsd_avx512f(auVar60,auVar58);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       dVar45 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3];
  auVar58 = vaddsd_avx512f(auVar94,auVar58);
  auVar60 = vmulsd_avx512f(local_218,auVar62);
  auVar51 = vmulsd_avx512f(auVar126,auVar121);
  auVar62 = vmulsd_avx512f(auVar133,auVar121);
  auVar66 = vmulsd_avx512f(auVar49,auVar133);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  local_220 = auVar58._0_8_;
  local_228 = dVar45 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
              auVar60._0_8_ +
              local_b0 * -2.0 *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7];
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       local_b0 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar58 = vaddsd_avx512f(auVar51,auVar103);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar60 = vmulsd_avx512f(auVar125,auVar52);
  auVar60 = vaddsd_avx512f(auVar62,auVar60);
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       local_c8 *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar60 = vaddsd_avx512f(auVar104,auVar60);
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  dVar45 = local_c8 *
           (local_c8 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] +
           dVar3 * local_98 +
           local_b0 *
           (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1]) +
           local_b0 *
           (local_c8 *
            (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3] + auVar58._0_8_) + local_98 * auVar60._0_8_;
  auVar60 = vunpcklpd_avx(auVar125,auVar47);
  auVar51 = vunpcklpd_avx(auVar121,auVar48);
  auVar58 = vmulpd_avx512vl(auVar60,auVar53);
  auVar52 = vmulpd_avx512vl(auVar51,auVar54);
  auVar135._8_8_ = local_d8;
  auVar135._0_8_ = local_d8;
  auVar127._8_8_ = local_c0;
  auVar127._0_8_ = local_c0;
  auVar134._0_8_ =
       local_d8 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar134._8_8_ =
       local_d8 *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar53 = vmulpd_avx512vl(auVar135,*(undefined1 (*) [16])
                                      (zzF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar54 = vmulpd_avx512vl(auVar135,*(undefined1 (*) [16])
                                      (yzF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar67 = vaddpd_avx512vl(auVar58,auVar52);
  auVar58 = vunpcklpd_avx512vl(auVar105,auVar84);
  auVar52 = vunpcklpd_avx(auVar84,local_218);
  auVar68 = vmulsd_avx512f(auVar49,auVar105);
  auVar69 = vmulpd_avx512vl(auVar48,auVar58);
  uStack_230 = 0;
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar58 = vfmadd231pd_fma(auVar134,auVar127,
                            *(undefined1 (*) [16])
                             ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array + 3));
  auVar53 = vfmadd231pd_avx512vl
                      (auVar53,auVar127,
                       *(undefined1 (*) [16])
                        ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar127,
                       *(undefined1 (*) [16])
                        ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar128._8_8_ = local_a8;
  auVar128._0_8_ = local_a8;
  auVar62 = vfmadd231pd_fma(auVar58,auVar128,
                            *(undefined1 (*) [16])
                             ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array + 6));
  auVar70 = vfmadd231pd_avx512vl
                      (auVar54,auVar128,
                       *(undefined1 (*) [16])
                        ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar71 = vfmadd231pd_avx512vl
                      (auVar53,auVar128,
                       *(undefined1 (*) [16])
                        ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar46._8_8_ = dStack_d0;
  auVar46._0_8_ = local_d8;
  auVar53 = vunpcklpd_avx(auVar120,auVar46);
  auVar58 = vmulpd_avx512vl(auVar53,auVar61);
  auVar67 = vaddpd_avx512vl(auVar58,auVar67);
  auVar72 = vmulpd_avx512vl(auVar120,auVar72);
  auVar58 = *(undefined1 (*) [16])
             ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array + 6);
  auVar57 = vfmadd231pd_avx512vl(auVar72,auVar57,auVar125);
  auVar61 = vfmadd231pd_avx512vl(auVar57,auVar58,auVar121);
  auVar64 = vfmadd231pd_avx512vl(auVar64,auVar49,auVar58);
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar168._8_8_ = 0;
  auVar168._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar57 = vunpcklpd_avx512vl(auVar168,auVar158);
  auVar57 = vmulpd_avx512vl(auVar47,auVar57);
  auVar57 = vaddpd_avx512vl(auVar57,auVar69);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar58 = vunpcklpd_avx512vl(auVar164,auVar80);
  auVar72 = vunpcklpd_avx512vl(auVar80,auVar143);
  auVar63 = vmovddup_avx512vl(auVar63);
  auVar81._0_8_ = auVar53._0_8_ * auVar72._0_8_;
  auVar81._8_8_ = auVar53._8_8_ * auVar72._8_8_;
  auVar72 = vunpcklpd_avx512vl(auVar158,auVar152);
  auVar58 = vmulpd_avx512vl(auVar46,auVar58);
  auVar53 = vmulpd_avx512vl(auVar132,*(undefined1 (*) [16])
                                      (xxF->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array);
  auVar69 = vmulsd_avx512f(auVar49,auVar164);
  auVar73 = vaddpd_avx512vl(auVar58,auVar57);
  auVar58 = vmulsd_avx512f(auVar49,auVar168);
  auVar74 = vunpcklpd_avx512vl(auVar55,auVar62);
  auVar53 = vfmadd231pd_avx512vl
                      (auVar53,auVar130,
                       *(undefined1 (*) [16])
                        ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 3));
  auVar85._0_8_ = auVar60._0_8_ * auVar72._0_8_ + auVar51._0_8_ * auVar52._0_8_;
  auVar85._8_8_ = auVar60._8_8_ * auVar72._8_8_ + auVar51._8_8_ * auVar52._8_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_228;
  auVar57 = vmulsd_avx512f(auVar49,auVar57);
  auVar60 = vaddpd_avx512vl(auVar81,auVar85);
  auVar82._8_8_ = 0x8000000000000000;
  auVar82._0_8_ = 0x8000000000000000;
  auVar51 = vfmadd231pd_avx512vl
                      (auVar53,auVar49,
                       *(undefined1 (*) [16])
                        ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array + 6));
  auVar86._0_8_ = -local_98;
  auVar86._8_8_ = -local_98;
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       dStack_b8 *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar58 = vaddsd_avx512f(auVar58,auVar95);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar72 = vmulsd_avx512f(auVar132,auVar72);
  auVar58 = vaddsd_avx512f(auVar72,auVar58);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar72 = vmulsd_avx512f(auVar130,auVar53);
  auVar72 = vaddsd_avx512f(auVar68,auVar72);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar52 = vmulsd_avx512f(auVar132,auVar54);
  auVar72 = vaddsd_avx512f(auVar52,auVar72);
  auVar52 = vshufpd_avx512vl(auVar64,auVar64,1);
  auVar52 = vmulpd_avx512vl(auVar47,auVar52);
  auVar72 = vmulsd_avx512f(auVar49,auVar72);
  auVar53 = vunpckhpd_avx512vl(auVar60,auVar63);
  auVar54 = vunpckhpd_avx512vl(auVar70,auVar59);
  auVar68 = vunpcklpd_avx512vl(auVar70,auVar59);
  auVar75 = vunpckhpd_avx512vl(auVar55,auVar62);
  auVar106._0_8_ = local_b0 * auVar75._0_8_;
  auVar106._8_8_ = local_b0 * auVar75._8_8_;
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = dStack_d0 * auVar65._0_8_ + dStack_b8 * local_220 + auVar57._0_8_ +
        local_c8 *
        (local_c8 *
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + dVar2 * local_98 +
               local_b0 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1]) +
        local_b0 *
        (local_c8 *
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + auVar50._0_8_ +
               local_b0 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4]) +
        local_98 *
        (auVar56._0_8_ +
        local_c8 *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6]) + dStack_d0 *
               (dStack_d0 *
                (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
               auVar69._0_8_ +
               dStack_b8 *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1]) + dStack_b8 * auVar58._0_8_ + auVar72._0_8_;
  auVar72 = vxorpd_avx512vl(auVar49,auVar82);
  auVar96._8_8_ = auVar86._0_8_;
  auVar96._0_8_ = auVar86._0_8_;
  auVar57 = vmulpd_avx512vl(auVar67,auVar96);
  auVar57 = vsubpd_avx(auVar57,auVar106);
  auVar58 = vmulpd_avx512vl(auVar120,auVar74);
  auVar57 = vsubpd_avx(auVar57,auVar58);
  auVar58 = vunpckhpd_avx512vl(auVar71,auVar64);
  auVar107._0_8_ = dStack_b8 * auVar58._0_8_;
  auVar107._8_8_ = dStack_b8 * auVar58._8_8_;
  dVar87 = auVar72._0_8_;
  auVar97._8_8_ = dVar87;
  auVar97._0_8_ = dVar87;
  auVar58 = vmulpd_avx512vl(auVar73,auVar97);
  auVar58 = vsubpd_avx(auVar58,auVar107);
  auVar50 = vunpcklpd_avx512vl(auVar71,auVar64);
  auVar108._0_8_ = dStack_d0 * auVar50._0_8_;
  auVar108._8_8_ = dStack_d0 * auVar50._8_8_;
  auVar58 = vsubpd_avx(auVar58,auVar108);
  auVar50 = vmulpd_avx512vl(auVar49,auVar60);
  auVar90._0_8_ =
       auVar58._0_8_ +
       auVar68._0_8_ * local_c8 + local_b0 * auVar54._0_8_ + auVar53._0_8_ * local_98 +
       auVar57._0_8_;
  auVar90._8_8_ =
       auVar58._8_8_ +
       auVar68._8_8_ * local_c8 + local_b0 * auVar54._8_8_ + auVar53._8_8_ * local_98 +
       auVar57._8_8_;
  auVar57 = vunpckhpd_avx512vl(auVar61,auVar70);
  auVar58 = vunpcklpd_avx512vl(auVar61,auVar70);
  auVar98._0_8_ = dStack_d0 * auVar58._0_8_ + dStack_b8 * auVar57._0_8_ + auVar50._0_8_;
  auVar98._8_8_ = dStack_d0 * auVar58._8_8_ + dStack_b8 * auVar57._8_8_ + auVar50._8_8_;
  auVar57 = vmulpd_avx512vl(auVar46,auVar64);
  auVar53 = vaddpd_avx512vl(auVar98,auVar90);
  auVar58 = vshufpd_avx512vl(auVar71,auVar71,1);
  auVar54 = vmulsd_avx512f(auVar48,auVar73);
  auVar50 = vshufpd_avx512vl(auVar73,auVar73,1);
  auVar50 = vmulpd_avx512vl(auVar48,auVar50);
  dVar2 = (double)vmovlpd_avx512f(auVar53);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [4] = dVar2;
  dVar2 = (double)vmovhpd_avx512f(auVar53);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = dVar2;
  auVar56 = vmulsd_avx512f(auVar46,auVar71);
  auVar52 = vaddpd_avx512vl(auVar52,auVar50);
  auVar50 = vxorpd_avx512vl(auVar48,auVar82);
  auVar57 = vaddpd_avx512vl(auVar57,auVar52);
  auVar52 = vmulsd_avx512f(auVar46,ZEXT816(0xc000000000000000));
  auVar50 = vunpcklpd_avx512vl(auVar50,ZEXT816(0xc000000000000000));
  auVar64 = vshufpd_avx512vl(auVar61,auVar61,1);
  auVar65 = vmulsd_avx512f(auVar52,auVar59);
  auVar52 = vmulsd_avx512f(auVar52,auVar61);
  auVar61 = vmulsd_avx512f(auVar47,ZEXT816(0xc000000000000000));
  auVar76._8_8_ = uStack_a0;
  auVar76._0_8_ = auVar86._0_8_;
  auVar65 = vunpcklpd_avx512vl(auVar57,auVar65);
  auVar57 = vshufpd_avx512vl(auVar60,auVar48,1);
  auVar64 = vmulsd_avx512f(auVar61,auVar64);
  auVar57 = vmulpd_avx512vl(auVar57,auVar50);
  auVar50 = vshufpd_avx512vl(auVar57,auVar57,1);
  auVar60 = vmulsd_avx512f(auVar50,auVar60);
  auVar60 = vaddsd_avx512f(auVar64,auVar60);
  auVar77._8_8_ = dStack_b8;
  auVar77._0_8_ = local_b0;
  auVar60 = vaddsd_avx512f(auVar52,auVar60);
  auVar78._8_8_ = dStack_d0;
  auVar78._0_8_ = local_c8;
  auVar52 = vshufpd_avx512vl(auVar70,auVar70,1);
  auVar79._0_8_ = auVar70._0_8_;
  auVar79._8_8_ = auVar59._8_8_;
  local_178._8_8_ = dStack_d0;
  local_178._0_8_ = local_d8;
  auVar99._0_8_ = local_c0 * auVar52._0_8_;
  auVar99._8_8_ = dStack_b8 * auVar52._8_8_;
  auVar52 = vsubpd_avx512vl(auVar57,auVar99);
  auVar57 = vmulpd_avx512vl(auVar57,auVar63);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_a8;
  auVar50 = vmovddup_avx512vl(auVar50);
  local_168 = (double)vmovlpd_avx(auVar120);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = auVar56._0_8_ + local_c0 * auVar58._0_8_ + auVar54._0_8_ + auVar60._0_8_ + dVar45;
  auVar58 = vmovddup_avx512vl(auVar51);
  auVar58 = vmulpd_avx512vl(auVar58,auVar78);
  auVar60 = vshufpd_avx512vl(auVar51,auVar51,3);
  auVar60 = vmulpd_avx512vl(auVar60,auVar77);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dStack_d0 * dVar3 + dStack_b8 * dVar4 + auVar66._0_8_;
  auVar51 = vmovddup_avx512vl(auVar56);
  auVar51 = vmulpd_avx512vl(auVar51,auVar76);
  auVar54 = vsubpd_avx512vl(auVar51,auVar60);
  auVar60 = vaddpd_avx512vl(auVar51,auVar60);
  auVar51 = vsubpd_avx512vl(auVar54,auVar58);
  auVar60 = vaddpd_avx512vl(auVar60,auVar58);
  auVar58 = vunpcklpd_avx512vl(auVar46,auVar61);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_c0;
  auVar54 = vmovddup_avx512vl(auVar59);
  auVar58 = vmulpd_avx512vl(auVar58,auVar79);
  auStack_160._8_8_ = dStack_b8;
  auStack_160._0_8_ = local_c0;
  auVar52 = vsubpd_avx512vl(auVar52,auVar58);
  auVar56 = vaddpd_avx512vl(auVar57,auVar58);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_d8;
  auVar59 = vmovddup_avx512vl(auVar61);
  auVar57 = vunpcklpd_avx(auVar48,auVar47);
  auVar58 = vunpcklpd_avx(auVar47,auVar48);
  auVar61 = vmulpd_avx512vl(auVar135,auVar74);
  auVar55 = vunpckhpd_avx512vl(auVar55,auVar67);
  local_148._8_8_ = uStack_a0;
  local_148._0_8_ = local_a8;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_b0;
  vmovsd_avx512f(auVar137);
  local_1a8 = vunpckhpd_avx(auVar47,auVar48);
  auVar91._0_8_ =
       auVar61._0_8_ + auVar58._0_8_ * auVar55._0_8_ + auVar67._0_8_ * auVar57._0_8_ +
       auVar51._0_8_ + auVar52._0_8_ + auVar65._0_8_;
  auVar91._8_8_ =
       auVar61._8_8_ + auVar58._8_8_ * auVar55._8_8_ + auVar62._8_8_ * auVar57._8_8_ +
       auVar60._8_8_ + auVar56._8_8_ + auVar65._8_8_;
  *(undefined1 (*) [16])
   ((local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
   + 9) = auVar91;
  *(undefined1 (*) [16])
   ((local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
   + 1) = auVar53;
  dVar2 = (double)vmovlpd_avx(auVar91);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [6] = dVar2;
  local_1c8 = vunpcklpd_avx(auVar46,auVar47);
  local_1b8 = local_a8;
  dStack_1b0 = dStack_d0;
  local_198 = (double)vmovlpd_avx(auVar120);
  dStack_190 = local_b0;
  dStack_188 = local_98;
  local_118 = local_a8;
  dStack_110 = dStack_d0;
  local_f8._8_8_ = local_b0;
  local_f8._0_8_ = local_198;
  local_138 = local_98;
  local_e8 = (double)vmovlpd_avx(auVar121);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_98;
  auVar58 = vmovddup_avx512vl(auVar62);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dStack_d0;
  auVar57 = vmovddup_avx512vl(auVar55);
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar60 = vmulsd_avx512f(local_178,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dStack_d0;
  auVar51 = vmulsd_avx512f(auVar153,auVar64);
  dVar2 = (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0xb];
  dVar3 = (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x14];
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar52 = vmulsd_avx512f(auVar58,auVar65);
  dVar4 = (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [8];
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_b0;
  auVar53 = vmulsd_avx512f(auVar138,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dStack_b8;
  auVar56 = vmulsd_avx512f(auVar159,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uStack_a0;
  auVar61 = vmulsd_avx512f(auVar165,auVar68);
  auVar52 = vaddsd_avx512f(auVar61,auVar52);
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar61 = vmulsd_avx512f(auVar58,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar62 = vmulsd_avx512f(auStack_160,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar55 = vmulsd_avx512f(auStack_160,auVar71);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar63 = vmulsd_avx512f(auVar153,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar64 = vmulsd_avx512f(local_178,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar65 = vmulsd_avx512f(auVar138,auVar75);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x11];
  auVar66 = vmulsd_avx512f(auVar138,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xe];
  auVar67 = vmulsd_avx512f(auVar159,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x17];
  auVar68 = vmulsd_avx512f(auVar165,auVar7);
  auVar61 = vaddsd_avx512f(auVar68,auVar61);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x14];
  auVar68 = vmulsd_avx512f(local_148,auVar8);
  auVar61 = vaddsd_avx512f(auVar68,auVar61);
  auVar68 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (x1P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar68 = vfmadd231pd_avx512vl
                      (auVar68,auVar57,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  dVar43 = auVar67._0_8_ + auVar65._0_8_ + auVar61._0_8_ +
           local_c8 *
           (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
           array[8] + auVar62._0_8_ + auVar63._0_8_ + auVar64._0_8_;
  auVar61 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (y1P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar59 = vmulpd_avx512vl(auVar59,*(undefined1 (*) [16])
                                     (z1P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar109._8_8_ = local_168;
  auVar109._0_8_ = local_168;
  auVar62 = vfmadd231pd_avx512vl
                      (auVar68,auVar109,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar61 = vfmadd231pd_avx512vl
                      (auVar61,auVar57,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar57,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  local_128._8_8_ = local_1c8._8_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_128._8_8_;
  auVar63 = vmovddup_avx512vl(auVar9);
  auVar62 = vfmadd231pd_avx512vl
                      (auVar62,auVar54,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar57 = vfmadd231pd_fma(auVar61,auVar109,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar59,auVar109,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar110._8_8_ = dStack_b8;
  auVar110._0_8_ = dStack_b8;
  auVar61 = vfmadd231pd_avx512vl
                      (auVar62,auVar110,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar57 = vfmadd231pd_avx512vl
                      (auVar57,auVar54,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar59,auVar54,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dStack_150;
  auVar59 = vmovddup_avx512vl(auVar10);
  auVar61 = vfmadd231pd_avx512vl
                      (auVar61,auVar59,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar57 = vfmadd231pd_fma(auVar57,auVar110,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xc));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar110,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar111._8_8_ = uStack_a0;
  auVar111._0_8_ = uStack_a0;
  auVar61 = vfmadd231pd_avx512vl
                      (auVar61,auVar50,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar57 = vfmadd231pd_avx512vl
                      (auVar57,auVar59,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar59,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar59 = vfmadd231pd_avx512vl
                      (auVar61,auVar111,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar57 = vfmadd231pd_avx512vl
                      (auVar57,auVar50,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar50,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  local_128._0_8_ = local_1c8._0_8_;
  auVar50 = vfmadd231pd_avx512vl
                      (auVar59,auVar58,
                       *(undefined1 (*) [16])
                        ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar57 = vfmadd231pd_fma(auVar57,auVar111,
                            *(undefined1 (*) [16])
                             ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x15));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar111,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar59 = vmulsd_avx512f(local_178,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dStack_d0;
  auVar61 = vmulsd_avx512f(auVar154,auVar12);
  local_108._8_8_ = local_1a8._8_8_;
  auVar62 = vfmadd231pd_avx512vl
                      (auVar57,auVar58,
                       *(undefined1 (*) [16])
                        ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar54 = vfmadd231pd_avx512vl
                      (auVar54,auVar58,
                       *(undefined1 (*) [16])
                        ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar57 = vaddsd_avx512f(auVar59,auVar61);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar59 = vmulsd_avx512f(auVar120,auVar13);
  auVar59 = vaddsd_avx512f(auVar59,auVar55);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar58 = vmulsd_avx512f(auVar58,auVar14);
  auVar57 = vaddsd_avx512f(auVar57,auVar59);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dStack_b8;
  auVar59 = vmulsd_avx512f(auVar160,auVar15);
  auVar59 = vaddsd_avx512f(auVar59,auVar66);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar61 = vmulsd_avx512f(local_148,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uStack_a0;
  auVar55 = vmulsd_avx512f(auVar166,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar64 = vmulsd_avx512f(auVar121,auVar18);
  auVar58 = vaddsd_avx512f(auVar55,auVar58);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dStack_d0;
  auVar55 = vmulsd_avx512f(auVar150,auVar19);
  auVar58 = vaddsd_avx512f(auVar61,auVar58);
  auVar58 = vaddsd_avx512f(auVar59,auVar58);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_128._8_8_;
  auVar59 = vmulsd_avx512f(auVar147,auVar20);
  auVar61 = vaddsd_avx512f(auVar57,auVar58);
  auVar129._0_8_ =
       local_d8 *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[0]
  ;
  auVar129._8_8_ =
       local_d8 *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_128._0_8_;
  auVar57 = vmulsd_avx512f(auVar144,auVar21);
  auVar58 = vfmadd231pd_avx512vl
                      (auVar129,auVar63,
                       *(undefined1 (*) [16])
                        ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar57 = vaddsd_avx512f(auVar57,auVar59);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_a8;
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar59 = vmulsd_avx512f(auVar139,auVar22);
  auVar59 = vaddsd_avx512f(auVar59,auVar55);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_b0;
  auVar55 = vmulsd_avx512f(auVar161,auVar23);
  auVar57 = vaddsd_avx512f(auVar57,auVar59);
  local_108._0_8_ = local_1a8._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_108._0_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar59 = vmulsd_avx512f(auVar141,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_108._8_8_;
  auVar65 = vmulsd_avx512f(auVar155,auVar25);
  auVar55 = vaddsd_avx512f(auVar55,auVar64);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar64 = vmulsd_avx512f(auVar121,auVar26);
  auVar59 = vaddsd_avx512f(auVar59,auVar65);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_198;
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar65 = vmulsd_avx512f(auVar142,auVar27);
  auVar55 = vaddsd_avx512f(auVar65,auVar55);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar65 = vmulsd_avx512f(auVar150,auVar28);
  auVar59 = vaddsd_avx512f(auVar59,auVar55);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar55 = vmulsd_avx512f(auVar147,auVar29);
  auVar59 = vaddsd_avx512f(auVar57,auVar59);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar57 = vmulsd_avx512f(auVar144,auVar30);
  auVar57 = vaddsd_avx512f(auVar57,auVar55);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[8]
  ;
  auVar55 = vmulsd_avx512f(auVar48,auVar31);
  auVar55 = vaddsd_avx512f(auVar55,auVar65);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar65 = vmulsd_avx512f(auVar155,auVar32);
  auVar57 = vaddsd_avx512f(auVar57,auVar55);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xe];
  auVar55 = vmulsd_avx512f(auVar130,auVar33);
  auVar55 = vaddsd_avx512f(auVar55,auVar65);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar65 = vmulsd_avx512f(auVar161,auVar34);
  auVar64 = vaddsd_avx512f(auVar65,auVar64);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x14];
  auVar65 = vmulsd_avx512f(local_f8,auVar35);
  auVar64 = vaddsd_avx512f(auVar65,auVar64);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_128._0_8_;
  auVar65 = vmovddup_avx512vl(auVar36);
  auVar55 = vaddsd_avx512f(auVar55,auVar64);
  auVar55 = vaddsd_avx512f(auVar57,auVar55);
  auVar64 = vmulpd_avx512vl(auVar65,*(undefined1 (*) [16])
                                     (y2P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar65 = vmulpd_avx512vl(auVar65,*(undefined1 (*) [16])
                                     (z2P->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                                     m_storage.m_data.array);
  auVar112._8_8_ = local_a8;
  auVar112._0_8_ = local_a8;
  auVar57 = vfmadd231pd_fma(auVar58,auVar112,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 6));
  auVar58 = vfmadd231pd_avx512vl
                      (auVar64,auVar63,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar65,auVar63,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 3));
  auVar64 = vfmadd231pd_avx512vl
                      (auVar58,auVar112,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar112,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 6));
  auVar113._8_8_ = dStack_d0;
  auVar113._0_8_ = dStack_d0;
  auVar58 = vfmadd231pd_fma(auVar57,auVar113,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 9));
  auVar64 = vfmadd231pd_avx512vl
                      (auVar64,auVar113,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar113,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 9));
  auVar57 = vshufpd_avx(auVar47,auVar47,3);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[5]
  ;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_128._8_8_;
  auVar65 = vmulsd_avx512f(auVar148,auVar37);
  auVar58 = vfmadd231pd_fma(auVar58,auVar57,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xc));
  auVar64 = vfmadd231pd_avx512vl
                      (auVar64,auVar57,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar57,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xc));
  auVar114._8_8_ = local_108._8_8_;
  auVar114._0_8_ = local_108._8_8_;
  auVar57 = vfmadd231pd_fma(auVar58,auVar114,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0xf));
  auVar58 = vfmadd231pd_avx512vl
                      (auVar64,auVar114,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar114,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0xf));
  auVar115._8_8_ = local_198;
  auVar115._0_8_ = local_198;
  auVar57 = vfmadd231pd_fma(auVar57,auVar115,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x12));
  auVar58 = vfmadd231pd_avx512vl
                      (auVar58,auVar115,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar115,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x12));
  auVar116._8_8_ = local_b0;
  auVar116._0_8_ = local_b0;
  auVar57 = vfmadd231pd_fma(auVar57,auVar116,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x15));
  auVar64 = vfmadd231pd_avx512vl
                      (auVar58,auVar116,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar116,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x15));
  auVar117._8_8_ = local_e8;
  auVar117._0_8_ = local_e8;
  auVar58 = vfmadd231pd_fma(auVar57,auVar117,
                            *(undefined1 (*) [16])
                             ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                              m_storage.m_data.array + 0x18));
  auVar64 = vfmadd231pd_avx512vl
                      (auVar64,auVar117,
                       *(undefined1 (*) [16])
                        ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar63 = vfmadd231pd_avx512vl
                      (auVar63,auVar117,
                       *(undefined1 (*) [16])
                        ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                         m_storage.m_data.array + 0x18));
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[2]
  ;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_128._0_8_;
  auVar66 = vmulsd_avx512f(auVar145,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x1a];
  auVar57 = vmulsd_avx512f(auVar121,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xb];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dStack_d0;
  auVar67 = vmulsd_avx512f(auVar151,auVar40);
  auVar68 = vmulsd_avx512f(auVar120,auVar50);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x11];
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_108._8_8_;
  auVar69 = vmulsd_avx512f(auVar156,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x17];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_b0;
  auVar70 = vmulsd_avx512f(auVar162,auVar42);
  local_40 = 0;
  local_258 = 1.0;
  local_248.m_matrix = m11P;
  local_200.m_matrix.m_lhs.m_functor.m_other = -1.0;
  auVar70 = vaddsd_avx512f(auVar70,auVar57);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar43;
  auVar71 = vmulsd_avx512f(auVar121,auVar136);
  auVar73 = vmulsd_avx512f(auVar121,auVar55);
  auVar57 = vshufpd_avx(auVar62,auVar62,1);
  dVar44 = local_a8 *
           (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
           array[8] + auVar67._0_8_ + auVar65._0_8_ + auVar66._0_8_ +
           dStack_b8 *
           (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
           array[0xe] + auVar69._0_8_ +
           auVar70._0_8_ +
           local_198 *
           (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
           array[0x14];
  auVar124._8_8_ = 0;
  auVar124._0_8_ = local_b0 * auVar57._0_8_;
  auVar65 = vaddsd_avx512f(auVar124,auVar71);
  auVar66 = vmulsd_avx512f(auVar120,auVar64);
  auVar67 = vshufpd_avx512vl(auVar64,auVar64,1);
  auVar69 = vmulsd_avx512f(auVar125,auVar67);
  auVar69 = vaddsd_avx512f(auVar69,auVar73);
  auVar66 = vaddsd_avx512f(auVar66,auVar69);
  auVar72 = vmulsd_avx512f(auVar61,auVar72);
  auVar69 = vshufpd_avx512vl(auVar54,auVar54,1);
  auVar70 = vmulsd_avx512f(auVar130,auVar69);
  auVar72 = vsubsd_avx512f(auVar72,auVar70);
  auVar70 = vmulsd_avx512f(auVar132,auVar54);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_d8;
  auVar54 = vmulsd_avx512f(auVar54,auVar157);
  auVar72 = vsubsd_avx512f(auVar72,auVar70);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar65._0_8_ + auVar62._0_8_ * local_c8 + auVar66._0_8_;
  auVar72 = vaddsd_avx512f(auVar72,auVar118);
  auVar65 = vshufpd_avx512vl(auVar63,auVar63,1);
  auVar66 = vmulsd_avx512f(auVar130,auVar65);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar44 * dVar87;
  auVar66 = vsubsd_avx512f(auVar88,auVar66);
  auVar70 = vmulsd_avx512f(auVar132,auVar63);
  auVar66 = vsubsd_avx512f(auVar66,auVar70);
  auVar72 = vaddsd_avx512f(auVar72,auVar66);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_c0;
  pdVar1 = (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
           m_data.array + 0xc;
  vmovsd_avx512f(auVar72);
  *pdVar1 = *pdVar1;
  vmovsd_avx512f(auVar72);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_a8;
  auVar72 = vmulsd_avx512f(auVar65,auVar89);
  auVar61 = vmulsd_avx512f(auVar61,auVar122);
  auVar83._0_8_ = -local_a8;
  auVar83._8_8_ = 0x8000000000000000;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar69._0_8_ * local_c0;
  auVar61 = vaddsd_avx512f(auVar119,auVar61);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = local_a8 * dVar44;
  auVar72 = vaddsd_avx512f(auVar72,auVar100);
  auVar54 = vaddsd_avx512f(auVar54,auVar61);
  auVar61 = vmulsd_avx512f(auVar63,auVar157);
  auVar72 = vaddsd_avx512f(auVar61,auVar72);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       auVar60._0_8_ + auVar51._0_8_ + dVar2 * local_c0 + local_c8 * dVar4 +
       dVar3 * local_a8 + auVar52._0_8_ + auVar53._0_8_ + auVar56._0_8_;
  auVar60 = vmulsd_avx512f(auVar92,auVar86);
  auVar51 = vmulsd_avx512f(auVar59,auVar86);
  auVar52 = vmulsd_avx512f(auVar49,auVar92);
  auVar53 = vshufpd_avx512vl(auVar50,auVar50,1);
  auVar56 = vmulsd_avx512f(auVar125,auVar53);
  auVar60 = vsubsd_avx512f(auVar60,auVar56);
  auVar60 = vsubsd_avx512f(auVar60,auVar68);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = auVar54._0_8_ + auVar72._0_8_;
  auVar60 = vaddsd_avx512f(auVar60,auVar101);
  auVar72 = vshufpd_avx512vl(auVar58,auVar58,1);
  auVar54 = vmulsd_avx512f(auVar125,auVar72);
  local_238 = ((auVar51._0_8_ - auVar54._0_8_) - auVar58._0_8_ * local_c8) + auVar60._0_8_;
  auVar60 = vmulsd_avx512f(auVar130,auVar72);
  auVar72 = vmulsd_avx512f(auVar49,auVar59);
  auVar51 = vmulsd_avx512f(auVar132,auVar50);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_d8;
  auVar54 = vmulsd_avx512f(auVar62,auVar49);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = local_238;
  auVar50 = vmulsd_avx512f(auVar55,auVar83);
  auVar56 = vmulsd_avx512f(auVar64,auVar49);
  dVar4 = ((auVar50._0_8_ - auVar67._0_8_ * local_c0) - auVar56._0_8_) +
          auVar51._0_8_ + dStack_b8 * auVar53._0_8_ + auVar52._0_8_ +
          dStack_d0 * auVar58._0_8_ + auVar60._0_8_ + auVar72._0_8_ +
          ((dVar43 * auVar83._0_8_ - auVar57._0_8_ * local_c0) - auVar54._0_8_);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = dVar4;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_240.m_matrix = (non_const_type)local_80;
  local_200.m_matrix.m_rhs.m_matrix = (non_const_type)local_178;
  local_1d8 = &local_1d0;
  local_128 = local_1c8;
  local_108 = local_1a8;
  local_88 = (non_const_type)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_248,&local_200,&local_240,&local_258);
  local_1d0 = (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[8] * local_138 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * (double)local_178._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[2] * local_168 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[4] * (double)auStack_160._8_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[6] * (double)local_148._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[1] * (double)local_178._8_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[3] * (double)auStack_160._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[5] * dStack_150 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[7] * (double)local_148._8_8_;
  dVar2 = *local_1d8;
  local_40 = 0;
  local_258 = 1.0;
  local_248.m_matrix = m22P;
  local_200.m_matrix.m_lhs.m_functor.m_other = -1.0;
  local_200.m_matrix.m_rhs.m_matrix = (non_const_type)local_1c8;
  local_80 = ZEXT864(0) << 0x20;
  local_240.m_matrix = (non_const_type)local_80;
  local_1d8 = &local_1d0;
  local_88 = (non_const_type)local_80;
  local_38 = (non_const_type)local_178;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_248,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)&local_200,&local_240,&local_258);
  local_38 = (non_const_type)local_128;
  local_1d0 = (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[8] * local_e8 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * (double)local_128._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[2] * local_118 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[4] * (double)local_108._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[6] * (double)local_f8._0_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[1] * (double)local_128._8_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[3] * dStack_110 +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[5] * (double)local_108._8_8_ +
              (local_88->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[7] * (double)local_f8._8_8_;
  dVar3 = *local_1d8;
  local_40 = 0;
  local_258 = 1.0;
  local_248.m_matrix = m12P;
  local_200.m_matrix.m_lhs.m_functor.m_other = -2.0;
  local_200.m_matrix.m_rhs.m_matrix = (non_const_type)local_1c8;
  local_80._0_16_ = ZEXT816(0);
  local_80 = ZEXT1664(local_80._0_16_);
  local_240.m_matrix = (non_const_type)local_80;
  local_1d8 = &local_1d0;
  local_88 = (non_const_type)local_80;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            (&local_248,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)&local_200,&local_240,&local_258);
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = dVar2 + dVar3 + *local_1d8;
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [3] = dVar45;
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [7] = local_238;
  (local_250->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xb] = dVar4;
  return local_250;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeG(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const Eigen::Matrix<double,3,9> & x1P,
  const Eigen::Matrix<double,3,9> & y1P,
  const Eigen::Matrix<double,3,9> & z1P,
  const Eigen::Matrix<double,3,9> & x2P,
  const Eigen::Matrix<double,3,9> & y2P,
  const Eigen::Matrix<double,3,9> & z2P,
  const Eigen::Matrix<double,9,9> & m11P,
  const Eigen::Matrix<double,9,9> & m12P,
  const Eigen::Matrix<double,9,9> & m22P,
  const cayley_t & cayley)
{
  Eigen::Matrix4d G;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //todo: Fill the matrix G using the precomputed summation terms
  Eigen::Vector3d xxFr1t = xxF*R.row(1).transpose();
  Eigen::Vector3d yyFr0t = yyF*R.row(0).transpose();
  Eigen::Vector3d zzFr0t = zzF*R.row(0).transpose();
  Eigen::Vector3d yzFr0t = yzF*R.row(0).transpose();
  Eigen::Vector3d xyFr1t = xyF*R.row(1).transpose();
  Eigen::Vector3d xyFr2t = xyF*R.row(2).transpose();
  Eigen::Vector3d zxFr1t = zxF*R.row(1).transpose();
  Eigen::Vector3d zxFr2t = zxF*R.row(2).transpose();
  
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;

  temp =      R.row(2)*yzFr0t;
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyFr2t;
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzFr0t;
  G(0,1) += temp;
  temp =      R.row(1)*zxFr2t;
  G(0,1) += temp;

  temp =      R.row(2)*xyFr1t;
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyFr0t;
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxFr1t;
  G(0,2) += temp;
  temp =      R.row(1)*yzFr0t;
  G(0,2) += temp;

  temp =      R.row(0)*zzFr0t;
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxFr2t;
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;

  temp =      R.row(0)*zxFr1t;
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzFr0t;
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxFr1t;
  G(1,2) += temp;
  temp =      R.row(0)*xyFr2t;
  G(1,2) += temp;

  temp =      R.row(1)*xxFr1t;
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyFr1t;
  G(2,2) += temp;
  temp =      R.row(0)*yyFr0t;
  G(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  Eigen::Matrix<double,9,1> Rowst = Rows.transpose();
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Vector3d x1PC = x1P*Cols;
  Eigen::Vector3d y1PC = y1P*Cols;
  Eigen::Vector3d z1PC = z1P*Cols;
  
  Eigen::Vector3d x2PR = x2P*Rowst;
  Eigen::Vector3d y2PR = y2P*Rowst;
  Eigen::Vector3d z2PR = z2P*Rowst;
  
  temp =      R.row(2)*y1PC;
  G(0,3)  = temp;
  temp =      R.row(2)*y2PR;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1PC;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2PR;
  G(0,3) += temp;
  
  temp =      R.row(0)*z1PC;
  G(1,3)  = temp;
  temp =      R.row(0)*z2PR;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1PC;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2PR;
  G(1,3) += temp;
  
  temp =      R.row(1)*x1PC;
  G(2,3)  = temp;
  temp =      R.row(1)*x2PR;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1PC;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2PR;
  G(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rowst;
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);

  return G;
}